

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O1

size_t utf8cspn(void *src,void *reject)

{
  size_t in_RAX;
  size_t sVar1;
  size_t chars;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  char cVar5;
  bool bVar6;
  
  sVar2 = 0;
  do {
    sVar1 = sVar2;
    if (*src == '\0') {
      return sVar1;
    }
    cVar5 = *reject;
    bVar6 = cVar5 == '\0';
    if (bVar6) {
LAB_00111494:
      src = (void *)((long)src + 1);
      sVar1 = in_RAX;
      sVar2 = sVar1 + 1;
    }
    else {
      lVar4 = 0;
      pcVar3 = (char *)reject;
      do {
        if (cVar5 == *(char *)((long)src + lVar4)) {
          lVar4 = lVar4 + 1;
        }
        else {
          lVar4 = 0;
        }
        pcVar3 = pcVar3 + 1;
        cVar5 = *pcVar3;
        bVar6 = cVar5 == '\0';
        if (bVar6) goto LAB_00111494;
        sVar2 = sVar1;
      } while (lVar4 == 0);
    }
    in_RAX = sVar1;
    if (!bVar6) {
      return sVar1;
    }
  } while( true );
}

Assistant:

size_t utf8cspn(const void *src, const void *reject) {
  const char *s = (const char *)src;
  size_t chars = 0;

  while ('\0' != *s) {
    const char *r = (const char *)reject;
    size_t offset = 0;

    while ('\0' != *r) {
      // checking that if *r is the start of a utf8 codepoint
      // (it is not 0b10xxxxxx) and we have successfully matched
      // a previous character (0 < offset) - we found a match
      if ((0x80 != (0xc0 & *r)) && (0 < offset)) {
        return chars;
      } else {
        if (*r == s[offset]) {
          // part of a utf8 codepoint matched, so move our checking
          // onwards to the next byte
          offset++;
          r++;
        } else {
          // r could be in the middle of an unmatching utf8 code point,
          // so we need to march it on to the next character beginning,

          do {
            r++;
          } while (0x80 == (0xc0 & *r));

          // reset offset too as we found a mismatch
          offset = 0;
        }
      }
    }

    // the current utf8 codepoint in src did not match reject, but src
    // could have been partway through a utf8 codepoint, so we need to
    // march it onto the next utf8 codepoint starting byte
    do {
      s++;
    } while ((0x80 == (0xc0 & *s)));
    chars++;
  }

  return chars;
}